

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_cmSourceFile_*>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  cmSourceFile *local_90;
  cmSourceFile *sf_1;
  undefined1 local_80;
  _Base_ptr local_68;
  undefined1 local_60;
  undefined1 local_58 [8];
  value_type entry;
  cmSourceFile *sf;
  _Self local_20;
  iterator i;
  string *name_local;
  cmTargetTraceDependencies *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
       ::find(&this->NameMap,name);
  sf = (cmSourceFile *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
       ::end(&this->NameMap);
  bVar1 = std::operator==(&local_20,(_Self *)&sf);
  if (bVar1) {
    entry.second = cmMakefile::GetSourceFileWithOutput(this->Makefile,(string *)i._M_node);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
    ::pair<cmSourceFile_*&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
                *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node,
               &entry.second);
    _Var3 = std::
            map<std::__cxx11::string,cmSourceFile*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
            ::insert<std::pair<std::__cxx11::string_const,cmSourceFile*>&>
                      ((map<std::__cxx11::string,cmSourceFile*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourceFile*>>>
                        *)&this->NameMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
                        *)local_58);
    sf_1 = (cmSourceFile *)_Var3.first._M_node;
    local_80 = _Var3.second;
    local_68 = (_Base_ptr)sf_1;
    local_60 = local_80;
    local_20._M_node = (_Base_ptr)sf_1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>
             *)local_58);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>
           ::operator->(&local_20);
  local_90 = ppVar2->second;
  if (local_90 != (cmSourceFile *)0x0) {
    if (this->CurrentEntry != (SourceEntry *)0x0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                (&this->CurrentEntry->Depends,&local_90);
    }
    QueueSource(this,local_90);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  NameMapType::iterator i = this->NameMap.find(name);
  if (i == this->NameMap.end()) {
    // Check if we know how to generate this file.
    cmSourceFile* sf = this->Makefile->GetSourceFileWithOutput(name);
    NameMapType::value_type entry(name, sf);
    i = this->NameMap.insert(entry).first;
  }
  if (cmSourceFile* sf = i->second) {
    // Record the dependency we just followed.
    if (this->CurrentEntry) {
      this->CurrentEntry->Depends.push_back(sf);
    }
    this->QueueSource(sf);
  }
}